

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Nonnull<const_char_*> pcVar2;
  
  iVar1 = this->current_size_;
  if ((long)iVar1 < 0) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>((long)iVar1,0,"n >= 0");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (0 < iVar1) {
      ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (this);
      return;
    }
    return;
  }
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>();
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }